

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern-computer.cpp
# Opt level: O3

WiningPatterns * __thiscall
mahjong::PatternComputer::recognize(WiningPatterns *__return_storage_ptr__,PatternComputer *this)

{
  _Rb_tree_header *p_Var1;
  pointer puVar2;
  pointer puVar3;
  set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_> p;
  _Rb_tree<mahjong::Pattern,_mahjong::Pattern,_std::_Identity<mahjong::Pattern>,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
  _Stack_58;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  puVar3 = (this->recognizers).
           super__Vector_base<std::unique_ptr<mahjong::PatternRecognizer,_std::default_delete<mahjong::PatternRecognizer>_>,_std::allocator<std::unique_ptr<mahjong::PatternRecognizer,_std::default_delete<mahjong::PatternRecognizer>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->recognizers).
           super__Vector_base<std::unique_ptr<mahjong::PatternRecognizer,_std::default_delete<mahjong::PatternRecognizer>_>,_std::allocator<std::unique_ptr<mahjong::PatternRecognizer,_std::default_delete<mahjong::PatternRecognizer>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar3 != puVar2) {
    do {
      (*((puVar3->_M_t).
         super___uniq_ptr_impl<mahjong::PatternRecognizer,_std::default_delete<mahjong::PatternRecognizer>_>
         ._M_t.
         super__Tuple_impl<0UL,_mahjong::PatternRecognizer_*,_std::default_delete<mahjong::PatternRecognizer>_>
         .super__Head_base<0UL,_mahjong::PatternRecognizer_*,_false>._M_head_impl)->
        _vptr_PatternRecognizer[5])(&_Stack_58);
      std::
      _Rb_tree<mahjong::Pattern,mahjong::Pattern,std::_Identity<mahjong::Pattern>,std::less<mahjong::Pattern>,std::allocator<mahjong::Pattern>>
      ::_M_insert_range_unique<std::_Rb_tree_const_iterator<mahjong::Pattern>>
                ((_Rb_tree<mahjong::Pattern,mahjong::Pattern,std::_Identity<mahjong::Pattern>,std::less<mahjong::Pattern>,std::allocator<mahjong::Pattern>>
                  *)__return_storage_ptr__,
                 (_Rb_tree_const_iterator<mahjong::Pattern>)
                 _Stack_58._M_impl.super__Rb_tree_header._M_header._M_left,
                 (_Rb_tree_const_iterator<mahjong::Pattern>)&_Stack_58._M_impl.super__Rb_tree_header
                );
      std::
      _Rb_tree<mahjong::Pattern,_mahjong::Pattern,_std::_Identity<mahjong::Pattern>,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
      ::~_Rb_tree(&_Stack_58);
      puVar3 = puVar3 + 1;
    } while (puVar3 != puVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

PatternComputer::WiningPatterns PatternComputer::recognize()
{
	set<Pattern> patterns;

	for (auto& it : recognizers)
	{
		auto p = it->recognize();
		patterns.insert(p.begin(), p.end());
	}

	return patterns;
}